

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firework.cpp
# Opt level: O2

void __thiscall Firework::update(Firework *this)

{
  anon_struct_8_2_947311e6_for_anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3_0
  aVar1;
  pointer pPVar2;
  bool bVar3;
  iterator __position;
  Particle *particle;
  pointer this_00;
  anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3 aVar4;
  
  if (this->exploded == false) {
    Particle::update(&this->rocket);
    if (0.0 <= (this->rocket).velocity.field_0.field_0.y) {
      explode(this);
      return;
    }
  }
  else {
    pPVar2 = (this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (this_00 = (this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl
                   .super__Vector_impl_data._M_start; this_00 != pPVar2; this_00 = this_00 + 1) {
      aVar1 = (this_00->velocity).field_0.field_0;
      aVar4._0_4_ = aVar1.x * (float)0x3f733333;
      aVar4._4_4_ = aVar1.y * (float)0x3f733333;
      (this_00->velocity).field_0 = aVar4;
      Particle::update(this_00);
    }
    __position._M_current =
         (this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
         super__Vector_impl_data._M_start;
    while (__position._M_current !=
           (this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
           super__Vector_impl_data._M_finish) {
      bVar3 = Particle::isDead(__position._M_current);
      if (bVar3) {
        __position = std::vector<Particle,_std::allocator<Particle>_>::erase
                               (&this->particles,__position._M_current);
      }
      else {
        __position._M_current = __position._M_current + 1;
      }
    }
  }
  return;
}

Assistant:

void Firework::update() {
    if (!exploded) {
        rocket.update();
        if (rocket.velocity.y >= 0.0f) {
            explode();
        }
    } else {
        for (Particle& particle : particles) {
            particle.velocity *= 0.95;
            particle.update();
        }
        std::vector<Particle>::iterator it = particles.begin();
        while(it != particles.end()) {
            if ((*it).isDead()) {
                it = particles.erase(it);
            } else {
                it++;
            }
        }
    }
}